

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebServer.h
# Opt level: O0

bool __thiscall WebServer::verifyUser(WebServer *this,string *user,string *pwd)

{
  __type _Var1;
  mapped_type *__lhs;
  MutexLockGuard local_28;
  MutexLockGuard lock;
  string *pwd_local;
  string *user_local;
  WebServer *this_local;
  
  lock.mutex = (MutexLock *)pwd;
  MutexLockGuard::MutexLockGuard(&local_28,&this->mutex_);
  __lhs = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator[](&this->users,user);
  _Var1 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )lock.mutex);
  MutexLockGuard::~MutexLockGuard(&local_28);
  return _Var1;
}

Assistant:

bool verifyUser(const std::string& user, const std::string& pwd) { MutexLockGuard lock(mutex_); return users[user] == pwd;}